

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Logging.cpp
# Opt level: O3

void __thiscall Logger::Logger(Logger *this,char *fileName,int line)

{
  allocator<char> local_19;
  
  memset(this,0,0xfa8);
  (this->impl_).stream_.buffer_.cur_ = (this->impl_).stream_.buffer_.data_;
  (this->impl_).line_ = line;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&(this->impl_).basename_,fileName,&local_19);
  Impl::formatTime(&this->impl_);
  return;
}

Assistant:

Logger::Logger(const char* fileName, int line)
        :impl_(fileName, line){ }